

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

char * AvisynthPluginInit3(IScriptEnvironment *env,AVS_Linkage *linkage)

{
  char *pcVar1;
  _func_void_IScriptEnvironment_ptr **RegisterFilter;
  pointer pp_Var2;
  initializer_list<void_(*)(IScriptEnvironment_*)> __l;
  vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_> filters;
  allocator_type local_41;
  vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_> local_40;
  _func_void_IScriptEnvironment_ptr *local_28;
  code *local_20;
  
  local_28 = AVSInterface::RegisterFilter<MiniDeen>;
  local_20 = AVSInterface::RegisterFilter<LegacyMiniDeen>;
  __l._M_len = 2;
  __l._M_array = &local_28;
  AVS_linkage = linkage;
  std::vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>::
  vector(&local_40,__l,&local_41);
  pcVar1 = Plugin::Description;
  for (pp_Var2 = local_40.
                 super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
                 ._M_impl.super__Vector_impl_data._M_start; Plugin::Description = pcVar1,
      pp_Var2 !=
      local_40.
      super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
      ._M_impl.super__Vector_impl_data._M_finish; pp_Var2 = pp_Var2 + 1) {
    (**pp_Var2)(env);
    pcVar1 = Plugin::Description;
  }
  if (local_40.
      super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pcVar1;
}

Assistant:

__declspec(dllexport) const char* __stdcall AvisynthPluginInit3(IScriptEnvironment* env, AVS_Linkage* linkage)
{
  AVS_linkage = linkage;
  auto filters = RegisterAVSFilters();
  for (auto &&RegisterFilter : filters) {
    RegisterFilter(env);
  }
  return Plugin::Description;
}